

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O2

void __thiscall Parse::SMTLIB2::readBenchmark(SMTLIB2 *this,LExprList *bench)

{
  Scopes *this_00;
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
  **ppDVar1;
  Expression **ppEVar2;
  bool bVar3;
  bool bVar4;
  LExpr *pLVar5;
  LExprList *pLVar6;
  Iterator IVar7;
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *pDVar8;
  LExprList *pLVar9;
  LExpr *pLVar10;
  List<Shell::LispParser::Expression_*> *pLVar11;
  UserErrorException *pUVar12;
  ostream *poVar13;
  Color color;
  string *this_01;
  string *psVar14;
  LispListReader ibRdr;
  allocator<char> local_739;
  string arity;
  string local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  LispListReader bRdr;
  string local_6d0;
  string name;
  LispListReader iSortRdr;
  LispListReader iArgRdr;
  string local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  string local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = &this->_scopes;
  bRdr.it._lst = (Iterator)(Iterator)bench;
LAB_004d1e75:
  do {
    while( true ) {
      if (bRdr.it._lst == (List<Shell::LispParser::Expression_*> *)0x0) {
        return;
      }
      pLVar5 = Shell::LispListReader::readNext(&bRdr);
      this->_topLevelExpr = pLVar5;
      this->_nextVar = 0;
      Shell::LispListReader::LispListReader(&ibRdr,pLVar5);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"set-logic",(allocator<char> *)&name);
      bVar3 = Shell::LispListReader::tryAcceptAtom(&ibRdr,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      psVar14 = &name;
      if (!bVar3) break;
      if (this->_logicSet == true) {
        pUVar12 = (UserErrorException *)__cxa_allocate_exception(0x50);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6f8,"set-logic can appear only once in a problem",
                   (allocator<char> *)&local_6d0);
        std::operator+(&arity,&local_6f8," in top-level expression \'");
        Shell::LispParser::Expression::toString_abi_cxx11_(&local_718,this->_topLevelExpr,true);
        std::operator+(&name,&arity,&local_718);
        std::operator+(&local_470,&name,"\'");
        Lib::UserErrorException::Exception(pUVar12,&local_470);
        __cxa_throw(pUVar12,&Lib::UserErrorException::typeinfo,
                    Lib::UserErrorException::~UserErrorException);
      }
      Shell::LispListReader::readAtom_abi_cxx11_(&name,&ibRdr);
      readLogic(this,&name);
LAB_004d2067:
      std::__cxx11::string::~string((string *)psVar14);
LAB_004d206c:
      Shell::LispListReader::acceptEOL(&ibRdr);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"set-info",(allocator<char> *)&name);
    bVar3 = Shell::LispListReader::tryAcceptAtom(&ibRdr,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,":status",(allocator<char> *)&name);
      bVar3 = Shell::LispListReader::tryAcceptAtom(&ibRdr,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      if (bVar3) {
        Shell::LispListReader::readAtom_abi_cxx11_(&name,&ibRdr);
        this_01 = (string *)&this->_statusStr;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,":source",(allocator<char> *)&name);
        bVar3 = Shell::LispListReader::tryAcceptAtom(&ibRdr,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        if (!bVar3) {
          Shell::LispListReader::readAtom_abi_cxx11_(&local_50,&ibRdr);
          std::__cxx11::string::~string((string *)&local_50);
          Shell::LispListReader::readAtom_abi_cxx11_(&local_70,&ibRdr);
          psVar14 = &local_70;
          goto LAB_004d2067;
        }
        Shell::LispListReader::readAtom_abi_cxx11_(&name,&ibRdr);
        this_01 = (string *)&this->_sourceInfo;
      }
      std::__cxx11::string::operator=(this_01,(string *)&name);
      goto LAB_004d2067;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"declare-sort",(allocator<char> *)&name);
    bVar3 = Shell::LispListReader::tryAcceptAtom(&ibRdr,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    if (bVar3) {
      Shell::LispListReader::readAtom_abi_cxx11_(&name,&ibRdr);
      arity._M_dataplus._M_p = (pointer)&arity.field_2;
      arity._M_string_length = 0;
      arity.field_2._M_allocated_capacity = arity.field_2._M_allocated_capacity & 0xffffffffffffff00
      ;
      bVar3 = Shell::LispListReader::tryReadAtom(&ibRdr,&arity);
      if (!bVar3) {
        pUVar12 = (UserErrorException *)__cxa_allocate_exception(0x50);
        std::operator+(&local_6d0,"Unspecified arity while declaring sort: ",&name);
        std::operator+(&local_718,&local_6d0," in top-level expression \'");
        Shell::LispParser::Expression::toString_abi_cxx11_
                  ((string *)&iSortRdr,this->_topLevelExpr,true);
        std::operator+(&local_6f8,&local_718,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &iSortRdr);
        std::operator+(&local_490,&local_6f8,"\'");
        Lib::UserErrorException::Exception(pUVar12,&local_490);
        __cxa_throw(pUVar12,&Lib::UserErrorException::typeinfo,
                    Lib::UserErrorException::~UserErrorException);
      }
      readDeclareSort(this,&name,&arity);
      Shell::LispListReader::acceptEOL(&ibRdr);
      std::__cxx11::string::~string((string *)&arity);
LAB_004d2321:
      std::__cxx11::string::~string((string *)&name);
      goto LAB_004d1e75;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"define-sort",(allocator<char> *)&name);
    bVar3 = Shell::LispListReader::tryAcceptAtom(&ibRdr,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    if (bVar3) {
      Shell::LispListReader::readAtom_abi_cxx11_(&name,&ibRdr);
      pLVar6 = Shell::LispListReader::readList(&ibRdr);
      if (ibRdr.it._lst == (List<Shell::LispParser::Expression_*> *)0x0) {
        pUVar12 = (UserErrorException *)__cxa_allocate_exception(0x50);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_718,"define-sort expects a sort definition body",
                   (allocator<char> *)&iSortRdr);
        std::operator+(&local_6f8,&local_718," in top-level expression \'");
        Shell::LispParser::Expression::toString_abi_cxx11_(&local_6d0,this->_topLevelExpr,true);
        std::operator+(&arity,&local_6f8,&local_6d0);
        std::operator+(&local_4b0,&arity,"\'");
        Lib::UserErrorException::Exception(pUVar12,&local_4b0);
        __cxa_throw(pUVar12,&Lib::UserErrorException::typeinfo,
                    Lib::UserErrorException::~UserErrorException);
      }
      pLVar5 = Shell::LispListReader::readNext(&ibRdr);
      readDefineSort(this,&name,pLVar6,pLVar5);
      Shell::LispListReader::acceptEOL(&ibRdr);
      goto LAB_004d2321;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"declare-fun",(allocator<char> *)&name);
    bVar3 = Shell::LispListReader::tryAcceptAtom(&ibRdr,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    if (bVar3) {
      Shell::LispListReader::readAtom_abi_cxx11_(&name,&ibRdr);
      IVar7._lst = Shell::LispListReader::readList(&ibRdr);
      iSortRdr.it._lst = (Iterator)(Iterator)IVar7._lst;
      pDVar8 = (DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                *)Lib::
                  DHMap<std::__cxx11::string,std::pair<Kernel::TermList,Kernel::TermList>,Lib::DefaultHash,Lib::DefaultHash2>
                  ::operator_new(0x28);
      pDVar8->_timestamp = 1;
      pDVar8->_size = 0;
      pDVar8->_deleted = 0;
      pDVar8->_capacityIndex = 0;
      pDVar8->_capacity = 0;
      *(undefined8 *)&pDVar8->_nextExpansionOccupancy = 0;
      *(undefined8 *)((long)&pDVar8->_entries + 4) = 0;
      *(undefined4 *)((long)&pDVar8->_afterLast + 4) = 0;
      Lib::
      Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
      ::push(this_00,pDVar8);
      if ((iSortRdr.it._lst != (List<Shell::LispParser::Expression_*> *)0x0) &&
         (pLVar5 = Shell::LispListReader::peekAtNext(&iSortRdr), pLVar5->tag == ATOM)) {
        pLVar5 = Shell::LispListReader::peekAtNext(&iSortRdr);
        bVar3 = std::operator==(&pLVar5->str,"par");
        if (bVar3) {
          Shell::LispListReader::acceptEOL(&ibRdr);
          Shell::LispListReader::readAtom_abi_cxx11_(&local_170,&iSortRdr);
          std::__cxx11::string::~string((string *)&local_170);
          readTypeParameters(this,&iSortRdr,pDVar8,(TermStack *)0x0);
          IVar7._lst = Shell::LispListReader::readList(&iSortRdr);
          ibRdr = iSortRdr;
        }
      }
      if (ibRdr.it._lst == (List<Shell::LispParser::Expression_*> *)0x0) {
        pUVar12 = (UserErrorException *)__cxa_allocate_exception(0x50);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_718,"declare-fun expects an output sort",
                   (allocator<char> *)&iArgRdr);
        std::operator+(&local_6f8,&local_718," in top-level expression \'");
        Shell::LispParser::Expression::toString_abi_cxx11_(&local_6d0,this->_topLevelExpr,true);
        std::operator+(&arity,&local_6f8,&local_6d0);
        std::operator+(&local_4d0,&arity,"\'");
        Lib::UserErrorException::Exception(pUVar12,&local_4d0);
        __cxa_throw(pUVar12,&Lib::UserErrorException::typeinfo,
                    Lib::UserErrorException::~UserErrorException);
      }
      pLVar5 = Shell::LispListReader::readNext(&ibRdr);
      readDeclareFun(this,&name,IVar7._lst,pLVar5,pDVar8->_size);
      Shell::LispListReader::acceptEOL(&ibRdr);
LAB_004d22f3:
      ppDVar1 = (this->_scopes)._cursor;
      (this->_scopes)._cursor = ppDVar1 + -1;
      pDVar8 = ppDVar1[-1];
      if (pDVar8 != (DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                     *)0x0) {
        Lib::
        DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
        ::~DHMap(pDVar8);
      }
      Lib::
      DHMap<std::__cxx11::string,std::pair<Kernel::TermList,Kernel::TermList>,Lib::DefaultHash,Lib::DefaultHash2>
      ::operator_delete(pDVar8,0x28);
      goto LAB_004d2321;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,"declare-datatype",(allocator<char> *)&name);
    bVar3 = Shell::LispListReader::tryAcceptAtom(&ibRdr,&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    if (bVar3) {
      pLVar5 = Shell::LispListReader::readNext(&ibRdr);
      pLVar6 = Shell::LispListReader::readList(&ibRdr);
      readDeclareDatatype(this,pLVar5,pLVar6);
      goto LAB_004d206c;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"declare-datatypes",(allocator<char> *)&name);
    bVar3 = Shell::LispListReader::tryAcceptAtom(&ibRdr,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    if (bVar3) {
      pLVar6 = Shell::LispListReader::readList(&ibRdr);
      pLVar9 = Shell::LispListReader::readList(&ibRdr);
      bVar3 = false;
LAB_004d23df:
      readDeclareDatatypes(this,pLVar6,pLVar9,bVar3);
      goto LAB_004d206c;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"declare-codatatypes",(allocator<char> *)&name);
    bVar3 = Shell::LispListReader::tryAcceptAtom(&ibRdr,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    if (bVar3) {
      pLVar6 = Shell::LispListReader::readList(&ibRdr);
      pLVar9 = Shell::LispListReader::readList(&ibRdr);
      bVar3 = true;
      goto LAB_004d23df;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,"declare-const",(allocator<char> *)&name);
    bVar3 = Shell::LispListReader::tryAcceptAtom(&ibRdr,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    if (bVar3) {
      Shell::LispListReader::readAtom_abi_cxx11_(&name,&ibRdr);
      if (ibRdr.it._lst == (List<Shell::LispParser::Expression_*> *)0x0) {
        pUVar12 = (UserErrorException *)__cxa_allocate_exception(0x50);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_718,"declare-const expects a const definition body",
                   (allocator<char> *)&iSortRdr);
        std::operator+(&local_6f8,&local_718," in top-level expression \'");
        Shell::LispParser::Expression::toString_abi_cxx11_(&local_6d0,this->_topLevelExpr,true);
        std::operator+(&arity,&local_6f8,&local_6d0);
        std::operator+(&local_4f0,&arity,"\'");
        Lib::UserErrorException::Exception(pUVar12,&local_4f0);
        __cxa_throw(pUVar12,&Lib::UserErrorException::typeinfo,
                    Lib::UserErrorException::~UserErrorException);
      }
      pLVar5 = Shell::LispListReader::readNext(&ibRdr);
      pDVar8 = (DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                *)Lib::
                  DHMap<std::__cxx11::string,std::pair<Kernel::TermList,Kernel::TermList>,Lib::DefaultHash,Lib::DefaultHash2>
                  ::operator_new(0x28);
      pDVar8->_timestamp = 1;
      pDVar8->_size = 0;
      pDVar8->_deleted = 0;
      pDVar8->_capacityIndex = 0;
      pDVar8->_capacity = 0;
      *(undefined8 *)&pDVar8->_nextExpansionOccupancy = 0;
      *(undefined8 *)((long)&pDVar8->_entries + 4) = 0;
      *(undefined4 *)((long)&pDVar8->_afterLast + 4) = 0;
      Lib::
      Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
      ::push(this_00,pDVar8);
      if (((pLVar5->tag == LIST) &&
          (Shell::LispListReader::LispListReader((LispListReader *)&arity,pLVar5),
          arity._M_dataplus._M_p != (pointer)0x0)) &&
         (pLVar10 = Shell::LispListReader::peekAtNext((LispListReader *)&arity),
         pLVar10->tag == ATOM)) {
        pLVar10 = Shell::LispListReader::peekAtNext((LispListReader *)&arity);
        bVar3 = std::operator==(&pLVar10->str,"par");
        if (bVar3) {
          Shell::LispListReader::acceptEOL(&ibRdr);
          Shell::LispListReader::readAtom_abi_cxx11_(&local_210,(LispListReader *)&arity);
          std::__cxx11::string::~string((string *)&local_210);
          readTypeParameters(this,(LispListReader *)&arity,pDVar8,(TermStack *)0x0);
          pLVar5 = Shell::LispListReader::readNext((LispListReader *)&arity);
          ibRdr.it._lst = (Iterator)(Iterator)arity._M_dataplus._M_p;
        }
      }
      readDeclareFun(this,&name,(LExprList *)0x0,pLVar5,pDVar8->_size);
      Shell::LispListReader::acceptEOL(&ibRdr);
      goto LAB_004d22f3;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_510,"define-fun",(allocator<char> *)&name);
    bVar3 = Shell::LispListReader::tryAcceptAtom(&ibRdr,&local_510);
    if (bVar3) {
      bVar4 = true;
      bVar3 = false;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,"define-fun-rec",(allocator<char> *)&arity);
      bVar4 = Shell::LispListReader::tryAcceptAtom(&ibRdr,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      bVar3 = bVar4;
    }
    std::__cxx11::string::~string((string *)&local_510);
    if (bVar4 != false) {
      Shell::LispListReader::readAtom_abi_cxx11_(&name,&ibRdr);
      IVar7._lst = Shell::LispListReader::readList(&ibRdr);
      iArgRdr.it._lst = (Iterator)(Iterator)IVar7._lst;
      pDVar8 = (DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                *)Lib::
                  DHMap<std::__cxx11::string,std::pair<Kernel::TermList,Kernel::TermList>,Lib::DefaultHash,Lib::DefaultHash2>
                  ::operator_new(0x28);
      pDVar8->_timestamp = 1;
      *(undefined4 *)((long)&pDVar8->_afterLast + 4) = 0;
      pDVar8->_size = 0;
      pDVar8->_deleted = 0;
      pDVar8->_capacityIndex = 0;
      pDVar8->_capacity = 0;
      *(undefined8 *)&pDVar8->_nextExpansionOccupancy = 0;
      *(undefined8 *)((long)&pDVar8->_entries + 4) = 0;
      arity.field_2._M_allocated_capacity = 0;
      arity.field_2._8_8_ = 0;
      arity._M_dataplus._M_p = (pointer)0x0;
      arity._M_string_length = 0;
      Lib::
      Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
      ::push(this_00,pDVar8);
      if ((iArgRdr.it._lst != (List<Shell::LispParser::Expression_*> *)0x0) &&
         (pLVar5 = Shell::LispListReader::peekAtNext(&iArgRdr), pLVar5->tag == ATOM)) {
        pLVar5 = Shell::LispListReader::peekAtNext(&iArgRdr);
        bVar4 = std::operator==(&pLVar5->str,"par");
        if (bVar4) {
          Shell::LispListReader::acceptEOL(&ibRdr);
          Shell::LispListReader::readAtom_abi_cxx11_(&local_250,&iArgRdr);
          std::__cxx11::string::~string((string *)&local_250);
          readTypeParameters(this,&iArgRdr,pDVar8,(TermStack *)&arity);
          IVar7._lst = Shell::LispListReader::readList(&iArgRdr);
          ibRdr = iArgRdr;
        }
      }
      if (ibRdr.it._lst == (List<Shell::LispParser::Expression_*> *)0x0) {
        pUVar12 = (UserErrorException *)__cxa_allocate_exception(0x50);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6d0,"define-fun expects an output sort",&local_739);
        std::operator+(&local_718,&local_6d0," in top-level expression \'");
        Shell::LispParser::Expression::toString_abi_cxx11_
                  ((string *)&iSortRdr,this->_topLevelExpr,true);
        std::operator+(&local_6f8,&local_718,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &iSortRdr);
        std::operator+(&local_530,&local_6f8,"\'");
        Lib::UserErrorException::Exception(pUVar12,&local_530);
        __cxa_throw(pUVar12,&Lib::UserErrorException::typeinfo,
                    Lib::UserErrorException::~UserErrorException);
      }
      pLVar5 = Shell::LispListReader::readNext(&ibRdr);
      if (ibRdr.it._lst == (List<Shell::LispParser::Expression_*> *)0x0) {
        pUVar12 = (UserErrorException *)__cxa_allocate_exception(0x50);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6d0,"define-fun expects a fun definition body",&local_739);
        std::operator+(&local_718,&local_6d0," in top-level expression \'");
        Shell::LispParser::Expression::toString_abi_cxx11_
                  ((string *)&iSortRdr,this->_topLevelExpr,true);
        std::operator+(&local_6f8,&local_718,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &iSortRdr);
        std::operator+(&local_550,&local_6f8,"\'");
        Lib::UserErrorException::Exception(pUVar12,&local_550);
        __cxa_throw(pUVar12,&Lib::UserErrorException::typeinfo,
                    Lib::UserErrorException::~UserErrorException);
      }
      pLVar10 = Shell::LispListReader::readNext(&ibRdr);
      readDefineFun(this,&name,IVar7._lst,pLVar5,pLVar10,(TermStack *)&arity,bVar3);
      Shell::LispListReader::acceptEOL(&ibRdr);
      ppDVar1 = (this->_scopes)._cursor;
      (this->_scopes)._cursor = ppDVar1 + -1;
      pDVar8 = ppDVar1[-1];
      if (pDVar8 != (DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                     *)0x0) {
        Lib::
        DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
        ::~DHMap(pDVar8);
      }
      Lib::
      DHMap<std::__cxx11::string,std::pair<Kernel::TermList,Kernel::TermList>,Lib::DefaultHash,Lib::DefaultHash2>
      ::operator_delete(pDVar8,0x28);
      Lib::Stack<Kernel::TermList>::~Stack((Stack<Kernel::TermList> *)&arity);
      goto LAB_004d2321;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"define-funs-rec",(allocator<char> *)&name);
    bVar3 = Shell::LispListReader::tryAcceptAtom(&ibRdr,&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    if (bVar3) {
      pLVar6 = Shell::LispListReader::readList(&ibRdr);
      pLVar9 = Shell::LispListReader::readList(&ibRdr);
      readDefineFunsRec(this,pLVar6,pLVar9);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_290,"assert",(allocator<char> *)&name);
      bVar3 = Shell::LispListReader::tryAcceptAtom(&ibRdr,&local_290);
      std::__cxx11::string::~string((string *)&local_290);
      if (bVar3) {
        if (ibRdr.it._lst == (List<Shell::LispParser::Expression_*> *)0x0) {
          pUVar12 = (UserErrorException *)__cxa_allocate_exception(0x50);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6f8,"assert expects a body",(allocator<char> *)&local_6d0);
          std::operator+(&arity,&local_6f8," in top-level expression \'");
          Shell::LispParser::Expression::toString_abi_cxx11_(&local_718,this->_topLevelExpr,true);
          std::operator+(&name,&arity,&local_718);
          std::operator+(&local_570,&name,"\'");
          Lib::UserErrorException::Exception(pUVar12,&local_570);
          __cxa_throw(pUVar12,&Lib::UserErrorException::typeinfo,
                      Lib::UserErrorException::~UserErrorException);
        }
        pLVar5 = Shell::LispListReader::readNext(&ibRdr);
        readAssert(this,pLVar5);
        goto LAB_004d206c;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b0,"assert-claim",(allocator<char> *)&name);
      bVar3 = Shell::LispListReader::tryAcceptAtom(&ibRdr,&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      if (bVar3) {
        if (ibRdr.it._lst == (List<Shell::LispParser::Expression_*> *)0x0) {
          pUVar12 = (UserErrorException *)__cxa_allocate_exception(0x50);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6f8,"assert expects a body",(allocator<char> *)&local_6d0);
          std::operator+(&arity,&local_6f8," in top-level expression \'");
          Shell::LispParser::Expression::toString_abi_cxx11_(&local_718,this->_topLevelExpr,true);
          std::operator+(&name,&arity,&local_718);
          std::operator+(&local_590,&name,"\'");
          Lib::UserErrorException::Exception(pUVar12,&local_590);
          __cxa_throw(pUVar12,&Lib::UserErrorException::typeinfo,
                      Lib::UserErrorException::~UserErrorException);
        }
        pLVar5 = Shell::LispListReader::readNext(&ibRdr);
        readAssertClaim(this,pLVar5);
        goto LAB_004d206c;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d0,"assert-not",(allocator<char> *)&name);
      bVar3 = Shell::LispListReader::tryAcceptAtom(&ibRdr,&local_2d0);
      std::__cxx11::string::~string((string *)&local_2d0);
      if (bVar3) {
        if (ibRdr.it._lst == (List<Shell::LispParser::Expression_*> *)0x0) {
          pUVar12 = (UserErrorException *)__cxa_allocate_exception(0x50);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6f8,"assert-not expects a body",(allocator<char> *)&local_6d0)
          ;
          std::operator+(&arity,&local_6f8," in top-level expression \'");
          Shell::LispParser::Expression::toString_abi_cxx11_(&local_718,this->_topLevelExpr,true);
          std::operator+(&name,&arity,&local_718);
          std::operator+(&local_5b0,&name,"\'");
          Lib::UserErrorException::Exception(pUVar12,&local_5b0);
          __cxa_throw(pUVar12,&Lib::UserErrorException::typeinfo,
                      Lib::UserErrorException::~UserErrorException);
        }
        pLVar5 = Shell::LispListReader::readNext(&ibRdr);
        readAssertNot(this,pLVar5);
        goto LAB_004d206c;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f0,"assert-theory",(allocator<char> *)&name);
      bVar3 = Shell::LispListReader::tryAcceptAtom(&ibRdr,&local_2f0);
      std::__cxx11::string::~string((string *)&local_2f0);
      if (bVar3) {
        if (ibRdr.it._lst == (List<Shell::LispParser::Expression_*> *)0x0) {
          pUVar12 = (UserErrorException *)__cxa_allocate_exception(0x50);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6f8,"assert-theory expects a body",
                     (allocator<char> *)&local_6d0);
          std::operator+(&arity,&local_6f8," in top-level expression \'");
          Shell::LispParser::Expression::toString_abi_cxx11_(&local_718,this->_topLevelExpr,true);
          std::operator+(&name,&arity,&local_718);
          std::operator+(&local_5d0,&name,"\'");
          Lib::UserErrorException::Exception(pUVar12,&local_5d0);
          __cxa_throw(pUVar12,&Lib::UserErrorException::typeinfo,
                      Lib::UserErrorException::~UserErrorException);
        }
        pLVar5 = Shell::LispListReader::readNext(&ibRdr);
        readAssertTheory(this,pLVar5);
        goto LAB_004d206c;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_310,"color-symbol",(allocator<char> *)&name);
      bVar3 = Shell::LispListReader::tryAcceptAtom(&ibRdr,&local_310);
      std::__cxx11::string::~string((string *)&local_310);
      if (bVar3) {
        Shell::LispListReader::readAtom_abi_cxx11_(&name,&ibRdr);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_330,":left",(allocator<char> *)&arity);
        bVar3 = Shell::LispListReader::tryAcceptAtom(&ibRdr,&local_330);
        std::__cxx11::string::~string((string *)&local_330);
        color = COLOR_LEFT;
        if (!bVar3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_350,":right",(allocator<char> *)&arity);
          bVar3 = Shell::LispListReader::tryAcceptAtom(&ibRdr,&local_350);
          std::__cxx11::string::~string((string *)&local_350);
          color = COLOR_RIGHT;
          if (!bVar3) {
            pUVar12 = (UserErrorException *)__cxa_allocate_exception(0x50);
            Shell::LispListReader::readAtom_abi_cxx11_((string *)&iSortRdr,&ibRdr);
            std::operator+(&local_6d0,"\'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &iSortRdr);
            std::operator+(&local_718,&local_6d0,"\' is not a color keyword");
            std::operator+(&local_6f8,&local_718," in top-level expression \'");
            Shell::LispParser::Expression::toString_abi_cxx11_
                      ((string *)&iArgRdr,this->_topLevelExpr,true);
            std::operator+(&arity,&local_6f8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &iArgRdr);
            std::operator+(&local_5f0,&arity,"\'");
            Lib::UserErrorException::Exception(pUVar12,&local_5f0);
            __cxa_throw(pUVar12,&Lib::UserErrorException::typeinfo,
                        Lib::UserErrorException::~UserErrorException);
          }
        }
        colorSymbol(this,&name,color);
        Shell::LispListReader::acceptEOL(&ibRdr);
        goto LAB_004d2321;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_370,"check-sat",(allocator<char> *)&name);
      bVar3 = Shell::LispListReader::tryAcceptAtom(&ibRdr,&local_370);
      std::__cxx11::string::~string((string *)&local_370);
      if (bVar3) {
        Shell::LispListReader::acceptEOL(&ibRdr);
        if (bRdr.it._lst == (List<Shell::LispParser::Expression_*> *)0x0) {
          return;
        }
        while( true ) {
          pLVar5 = Shell::LispListReader::readNext(&bRdr);
          Shell::LispListReader::LispListReader((LispListReader *)&name,pLVar5);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_430,"exit",(allocator<char> *)&arity);
          bVar3 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&name,&local_430);
          std::__cxx11::string::~string((string *)&local_430);
          if (bVar3) break;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_450,"get-unsat-core",(allocator<char> *)&arity);
          bVar3 = Shell::LispListReader::tryAcceptAtom((LispListReader *)&name,&local_450);
          std::__cxx11::string::~string((string *)&local_450);
          if (!bVar3) {
            if (*(int *)(Lib::env + 0x7500) == 0xb) {
              return;
            }
            poVar13 = std::operator<<((ostream *)&std::cout,
                                      "% Warning: check-sat is not the last entry. Skipping the rest!"
                                     );
            std::endl<char,std::char_traits<char>>(poVar13);
            return;
          }
          *(undefined4 *)(Lib::env + 0xd260) = 4;
          Shell::LispListReader::acceptEOL((LispListReader *)&name);
          if (bRdr.it._lst == (List<Shell::LispParser::Expression_*> *)0x0) {
            return;
          }
        }
        Shell::LispListReader::acceptEOL((LispListReader *)&name);
LAB_004d2ec3:
        Shell::LispListReader::acceptEOL(&bRdr);
        return;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_390,"exit",(allocator<char> *)&name);
      bVar3 = Shell::LispListReader::tryAcceptAtom(&ibRdr,&local_390);
      std::__cxx11::string::~string((string *)&local_390);
      if (bVar3) goto LAB_004d2ec3;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b0,"reset",(allocator<char> *)&name);
      bVar3 = Shell::LispListReader::tryAcceptAtom(&ibRdr,&local_3b0);
      std::__cxx11::string::~string((string *)&local_3b0);
      if (!bVar3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3d0,"set-option",(allocator<char> *)&name);
        bVar3 = Shell::LispListReader::tryAcceptAtom(&ibRdr,&local_3d0);
        std::__cxx11::string::~string((string *)&local_3d0);
        if (bVar3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3f0,":uncomputable",(allocator<char> *)&name);
          bVar3 = Shell::LispListReader::tryAcceptAtom(&ibRdr,&local_3f0);
          std::__cxx11::string::~string((string *)&local_3f0);
          if (bVar3) {
            pLVar11 = Shell::LispListReader::readList(&ibRdr);
            while (pLVar11 != (LExprList *)0x0) {
              ppEVar2 = &pLVar11->_head;
              pLVar11 = pLVar11->_tail;
              markSymbolUncomputable(this,&(*ppEVar2)->str);
            }
            goto LAB_004d206c;
          }
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_410,"push",(allocator<char> *)&name);
          bVar3 = Shell::LispListReader::tryAcceptAtom(&ibRdr,&local_410);
          std::__cxx11::string::~string((string *)&local_410);
          if (!bVar3) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_630,"get-info",(allocator<char> *)&name);
            bVar3 = Shell::LispListReader::tryAcceptAtom(&ibRdr,&local_630);
            std::__cxx11::string::~string((string *)&local_630);
            if (!bVar3) {
              pUVar12 = (UserErrorException *)__cxa_allocate_exception(0x50);
              Shell::LispListReader::readAtom_abi_cxx11_(&local_718,&ibRdr);
              std::operator+(&local_6f8,"unrecognized entry ",&local_718);
              std::operator+(&arity,&local_6f8," in top-level expression \'");
              Shell::LispParser::Expression::toString_abi_cxx11_
                        (&local_6d0,this->_topLevelExpr,true);
              std::operator+(&name,&arity,&local_6d0);
              std::operator+(&local_610,&name,"\'");
              Lib::UserErrorException::Exception(pUVar12,&local_610);
              __cxa_throw(pUVar12,&Lib::UserErrorException::typeinfo,
                          Lib::UserErrorException::~UserErrorException);
            }
          }
        }
      }
    }
  } while( true );
}

Assistant:

void SMTLIB2::readBenchmark(LExprList* bench)
{
  LispListReader bRdr(bench);

  bool afterCheckSat = false;

  // iteration over benchmark top level entries
  while(bRdr.hasNext()) {
    LExpr* lexp = bRdr.next();
    _topLevelExpr = lexp;
    _nextVar = 0;

    LOG2("readBenchmark ",lexp->toString(true));

    LispListReader ibRdr(lexp);

    if (ibRdr.tryAcceptAtom("set-logic")) {
      if (_logicSet) {
        USER_ERROR_EXPR("set-logic can appear only once in a problem");
      }
      readLogic(ibRdr.readAtom());
      ibRdr.acceptEOL();
      continue;
    }

    if (ibRdr.tryAcceptAtom("set-info")) {

      if (ibRdr.tryAcceptAtom(":status")) {
        _statusStr = ibRdr.readAtom();
        ibRdr.acceptEOL();
        continue;
      }

      if (ibRdr.tryAcceptAtom(":source")) {
        _sourceInfo = ibRdr.readAtom();
        ibRdr.acceptEOL();
        continue;
      }

      // ignore unknown info
      ibRdr.readAtom();
      ibRdr.readAtom();
      ibRdr.acceptEOL();
      continue;
    }

    if (ibRdr.tryAcceptAtom("declare-sort")) {
      std::string name = ibRdr.readAtom();
      std::string arity;
      if (!ibRdr.tryReadAtom(arity)) {
        USER_ERROR_EXPR("Unspecified arity while declaring sort: "+name);
      }

      readDeclareSort(name,arity);

      ibRdr.acceptEOL();

      continue;
    }

    if (ibRdr.tryAcceptAtom("define-sort")) {
      std::string name = ibRdr.readAtom();
      LExprList* args = ibRdr.readList();

      if (!ibRdr.hasNext()) {
        USER_ERROR_EXPR("define-sort expects a sort definition body");
      }
      LExpr* body = ibRdr.readNext();

      readDefineSort(name,args,body);

      ibRdr.acceptEOL();

      continue;
    }

    if (ibRdr.tryAcceptAtom("declare-fun")) {
      std::string name = ibRdr.readAtom();
      LExprList* iSorts = ibRdr.readList();
      LispListReader iSortRdr(iSorts);
      auto lookup = new TermLookup();
      _scopes.push(lookup);
      if (iSortRdr.hasNext() && iSortRdr.peekAtNext()->isAtom() && iSortRdr.peekAtNext()->str == PAR) {
        ibRdr.acceptEOL();
        iSortRdr.readAtom(); // the "par" atom
        readTypeParameters(iSortRdr, lookup);
        iSorts = iSortRdr.readList();
        ibRdr = iSortRdr;
      }
      if (!ibRdr.hasNext()) {
        USER_ERROR_EXPR("declare-fun expects an output sort");
      }
      LExpr* oSort = ibRdr.readNext();

      readDeclareFun(name,iSorts,oSort,lookup->size());

      ibRdr.acceptEOL();
      delete _scopes.pop();

      continue;
    }

    if (ibRdr.tryAcceptAtom("declare-datatype")) {
      LExpr *sort = ibRdr.readNext();
      LExprList *datatype = ibRdr.readList();

      readDeclareDatatype(sort, datatype);

      ibRdr.acceptEOL();

      continue;
    }

    if (ibRdr.tryAcceptAtom("declare-datatypes")) {
      LExprList* sorts = ibRdr.readList();
      LExprList* datatypes = ibRdr.readList();

      readDeclareDatatypes(sorts, datatypes, false);

      ibRdr.acceptEOL();

      continue;
    }

    if (ibRdr.tryAcceptAtom("declare-codatatypes")) {
      LExprList* sorts = ibRdr.readList();
      LExprList* datatypes = ibRdr.readList();

      readDeclareDatatypes(sorts, datatypes, true);

      ibRdr.acceptEOL();

      continue;
    }
    
    if (ibRdr.tryAcceptAtom("declare-const")) {
      std::string name = ibRdr.readAtom();
      if (!ibRdr.hasNext()) {
        USER_ERROR_EXPR("declare-const expects a const definition body");
      }
      LExpr* oSort = ibRdr.readNext();
      auto lookup = new TermLookup();
      _scopes.push(lookup);
      if (oSort->isList()) {
        LispListReader oSortRdr(oSort);
        if (oSortRdr.hasNext() && oSortRdr.peekAtNext()->isAtom() && oSortRdr.peekAtNext()->str == PAR) {
          ibRdr.acceptEOL();
          oSortRdr.readAtom(); // the "par" atom
          readTypeParameters(oSortRdr, lookup);
          oSort = oSortRdr.readNext();
          ibRdr = oSortRdr;
        }
      }

      readDeclareFun(name,nullptr,oSort,lookup->size());

      ibRdr.acceptEOL();
      delete _scopes.pop();

      continue;
    }

    bool recursive = false;
    if (ibRdr.tryAcceptAtom("define-fun") || (recursive = ibRdr.tryAcceptAtom("define-fun-rec"))) {
      std::string name = ibRdr.readAtom();
      LExprList* iArgs = ibRdr.readList();
      LispListReader iArgRdr(iArgs);
      auto lookup = new TermLookup();
      TermStack typeArgs;
      _scopes.push(lookup);
      if (iArgRdr.hasNext() && iArgRdr.peekAtNext()->isAtom() && iArgRdr.peekAtNext()->str == PAR) {
        ibRdr.acceptEOL();
        iArgRdr.readAtom(); // the "par" atom
        readTypeParameters(iArgRdr, lookup, &typeArgs);
        iArgs = iArgRdr.readList();
        ibRdr = iArgRdr;
      }
      if (!ibRdr.hasNext()) {
        USER_ERROR_EXPR("define-fun expects an output sort");
      }
      LExpr* oSort = ibRdr.readNext();
      if (!ibRdr.hasNext()) {
        USER_ERROR_EXPR("define-fun expects a fun definition body");
      }
      LExpr* body = ibRdr.readNext();

      readDefineFun(name,iArgs,oSort,body,typeArgs,recursive);

      ibRdr.acceptEOL();
      delete _scopes.pop();

      continue;
    }

    if (ibRdr.tryAcceptAtom("define-funs-rec")) {
      LExprList* declarations = ibRdr.readList();
      LExprList* definitions = ibRdr.readList();

      readDefineFunsRec(declarations, definitions);

      continue;
    }

    if (ibRdr.tryAcceptAtom("assert")) {
      if (!ibRdr.hasNext()) {
        USER_ERROR_EXPR("assert expects a body");
      }
      LExpr* body = ibRdr.readNext();
      readAssert(body);

      ibRdr.acceptEOL();

      continue;
    }

    if (ibRdr.tryAcceptAtom("assert-claim")) {
      if (!ibRdr.hasNext()) {
        USER_ERROR_EXPR("assert expects a body");
      }
      LExpr* body = ibRdr.readNext();
      readAssertClaim(body);

      ibRdr.acceptEOL();

      continue;
    }

    if (ibRdr.tryAcceptAtom("assert-not")) {
      if (!ibRdr.hasNext()) {
        USER_ERROR_EXPR("assert-not expects a body");
      }
      LExpr* body = ibRdr.readNext();
      readAssertNot(body);

      ibRdr.acceptEOL();

      continue;
    }

    if (ibRdr.tryAcceptAtom("assert-theory")) {
      if (!ibRdr.hasNext()) {
        USER_ERROR_EXPR("assert-theory expects a body");
      }
      LExpr* body = ibRdr.readNext();
      readAssertTheory(body);

      ibRdr.acceptEOL();

      continue;
    }

    // not an official SMTLIB command
    if (ibRdr.tryAcceptAtom("color-symbol")) {
      std::string symbol = ibRdr.readAtom();

      if (ibRdr.tryAcceptAtom(":left")) {
        colorSymbol(symbol, Color::COLOR_LEFT);
      } else if (ibRdr.tryAcceptAtom(":right")) {
        colorSymbol(symbol, Color::COLOR_RIGHT);
      } else {
        USER_ERROR_EXPR("'"+ibRdr.readAtom()+"' is not a color keyword");
      }

      ibRdr.acceptEOL();

      continue;
    }

    if (ibRdr.tryAcceptAtom("check-sat")) {
      ibRdr.acceptEOL();
      afterCheckSat = true;
      break;
    }

    if (ibRdr.tryAcceptAtom("exit")) {
      bRdr.acceptEOL();
      break;
    }

    if (ibRdr.tryAcceptAtom("reset")) {
      LOG1("ignoring reset");
      continue;
    }

    if (ibRdr.tryAcceptAtom("set-option")) {
      if (ibRdr.tryAcceptAtom(":uncomputable")) {
        LExprList* lel = ibRdr.readList();
        LExprList::Iterator lIt(lel);
        while (lIt.hasNext()) {
          LExpr* exp = lIt.next();
          ASS(exp->isAtom());
          std::string& name = exp->str;
          markSymbolUncomputable(name);
        }
        ibRdr.acceptEOL();
        continue;
      }
      LOG2("ignoring set-option", ibRdr.readAtom());
      continue;
    }

    if (ibRdr.tryAcceptAtom("push")) {
      LOG1("ignoring push");
      continue;
    }

    if (ibRdr.tryAcceptAtom("get-info")) {
      LOG2("ignoring get-info", ibRdr.readAtom());
      continue;
    }

    USER_ERROR_EXPR("unrecognized entry "+ibRdr.readAtom());
  }
  
  // the above while loop is aborted on the first check-sat,
  // however, we want to learn about an unsat core printing request
  // (or other things we might support in the future)
  if (afterCheckSat) {
    while(bRdr.hasNext()) {
      LispListReader ibRdr(bRdr.next());
      
      if (ibRdr.tryAcceptAtom("exit")) {
        ibRdr.acceptEOL(); // no arguments of exit
        bRdr.acceptEOL();  // exit should be the last thing in the file
        break;
      }
      
      if (ibRdr.tryAcceptAtom("get-unsat-core")) {
        env.options->setOutputMode(Options::Output::UCORE);
        ibRdr.acceptEOL(); // no arguments of get-unsat-core
        continue;
      }
      
      // can't read anything else (and it does not make sense to read get-unsat-core more than once)
      // so let's just warn and exit
      if(env.options->mode()!=Options::Mode::SPIDER) {
        std::cout << "% Warning: check-sat is not the last entry. Skipping the rest!" << endl;
      }
      break;
    }
  }
}